

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxout.cpp
# Opt level: O2

void __thiscall
ConfidentialTxOut_Constractor4_Test::TestBody(ConfidentialTxOut_Constractor4_Test *this)

{
  undefined8 lhs;
  char *pcVar1;
  Amount AVar2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar;
  int64_t local_118;
  Amount local_110;
  ConfidentialTxOut txout;
  
  AVar2 = cfd::core::Amount::CreateBySatoshiAmount(100000000);
  local_110.amount_ = AVar2.amount_;
  local_110.ignore_check_ = AVar2.ignore_check_;
  cfd::core::ConfidentialTxOut::ConfidentialTxOut(&txout,&exp_asset,&local_110);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)&gtest_ar_6,&txout.asset_);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
            ((string *)&gtest_ar_1,(ConfidentialAssetId *)&gtest_ar_6);
  lhs = gtest_ar_1._0_8_;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&gtest_ar_2,&exp_asset);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"txout.GetAsset().GetHex().c_str()","exp_asset.GetHex().c_str()",
             (char *)lhs,(char *)gtest_ar_2._0_8_);
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&gtest_ar_6);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_6);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x9b,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_6);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)&gtest_ar_6,&txout.confidential_value_);
  AVar2 = cfd::core::ConfidentialValue::GetAmount((ConfidentialValue *)&gtest_ar_6);
  gtest_ar_2._0_8_ = AVar2.amount_;
  gtest_ar_2.message_.ptr_._0_1_ = AVar2.ignore_check_;
  gtest_ar._0_8_ = cfd::core::Amount::GetSatoshiValue((Amount *)&gtest_ar_2);
  local_118 = cfd::core::Amount::GetSatoshiValue(&local_110);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&gtest_ar_1,"txout.GetConfidentialValue().GetAmount().GetSatoshiValue()",
             "amount.GetSatoshiValue()",(long *)&gtest_ar,&local_118);
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&gtest_ar_6);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_6);
    if ((undefined8 *)CONCAT71(gtest_ar_1.message_.ptr_._1_7_,gtest_ar_1.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)CONCAT71(gtest_ar_1.message_.ptr_._1_7_,gtest_ar_1.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x9d,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_6);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  cfd::core::AbstractTxOut::GetLockingScript((Script *)&gtest_ar_6,&txout.super_AbstractTxOut);
  cfd::core::Script::GetHex_abi_cxx11_((string *)&gtest_ar_1,(Script *)&gtest_ar_6);
  pcVar1 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txout.GetLockingScript().GetHex().c_str()","\"\"",
             (char *)gtest_ar_1._0_8_,"");
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  cfd::core::Script::~Script((Script *)&gtest_ar_6);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_6);
    if ((undefined8 *)CONCAT71(gtest_ar_2.message_.ptr_._1_7_,gtest_ar_2.message_.ptr_._0_1_) !=
        (undefined8 *)0x0) {
      pcVar1 = *(char **)CONCAT71(gtest_ar_2.message_.ptr_._1_7_,gtest_ar_2.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x9e,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_6);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  cfd::core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)&gtest_ar_6,&txout.nonce_);
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_
            ((string *)&gtest_ar_1,(ConfidentialNonce *)&gtest_ar_6);
  pcVar1 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txout.GetNonce().GetHex().c_str()","\"\"",
             (char *)gtest_ar_1._0_8_,"");
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  cfd::core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)&gtest_ar_6);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_6);
    if ((undefined8 *)CONCAT71(gtest_ar_2.message_.ptr_._1_7_,gtest_ar_2.message_.ptr_._0_1_) !=
        (undefined8 *)0x0) {
      pcVar1 = *(char **)CONCAT71(gtest_ar_2.message_.ptr_._1_7_,gtest_ar_2.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x9f,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_6);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_1,
             &txout.range_proof_.data_);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar_6,(ByteData *)&gtest_ar_1);
  pcVar1 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txout.GetRangeProof().GetHex().c_str()","\"\"",
             (char *)CONCAT71(gtest_ar_6._1_7_,gtest_ar_6.success_),"");
  std::__cxx11::string::~string((string *)&gtest_ar_6);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_1);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_6);
    if ((undefined8 *)CONCAT71(gtest_ar_2.message_.ptr_._1_7_,gtest_ar_2.message_.ptr_._0_1_) !=
        (undefined8 *)0x0) {
      pcVar1 = *(char **)CONCAT71(gtest_ar_2.message_.ptr_._1_7_,gtest_ar_2.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xa0,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_6);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_1,
             &txout.surjection_proof_.data_);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar_6,(ByteData *)&gtest_ar_1);
  pcVar1 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txout.GetSurjectionProof().GetHex().c_str()","\"\"",
             (char *)CONCAT71(gtest_ar_6._1_7_,gtest_ar_6.success_),"");
  std::__cxx11::string::~string((string *)&gtest_ar_6);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_1);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_6);
    if ((undefined8 *)CONCAT71(gtest_ar_2.message_.ptr_._1_7_,gtest_ar_2.message_.ptr_._0_1_) !=
        (undefined8 *)0x0) {
      pcVar1 = *(char **)CONCAT71(gtest_ar_2.message_.ptr_._1_7_,gtest_ar_2.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xa1,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_6);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  AVar2 = cfd::core::AbstractTxOut::GetValue(&txout.super_AbstractTxOut);
  gtest_ar_1._0_8_ = AVar2.amount_;
  gtest_ar_1.message_.ptr_._0_1_ = AVar2.ignore_check_;
  gtest_ar_2._0_8_ = cfd::core::Amount::GetSatoshiValue((Amount *)&gtest_ar_1);
  gtest_ar._0_8_ = gtest_ar._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar_6,"txout.GetValue().GetSatoshiValue()","0",(long *)&gtest_ar_2,
             (int *)&gtest_ar);
  if (gtest_ar_6.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar_6.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_6.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xa2,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_6.message_);
  cfd::core::ConfidentialTxOut::~ConfidentialTxOut(&txout);
  return;
}

Assistant:

TEST(ConfidentialTxOut, Constractor4) {
  // ConfidentialAssetId, ConfidentialValue
  Amount amount(Amount::CreateBySatoshiAmount(100000000));
  ConfidentialTxOut txout(exp_asset, amount);
  EXPECT_STREQ(txout.GetAsset().GetHex().c_str(), exp_asset.GetHex().c_str());
  EXPECT_EQ(txout.GetConfidentialValue().GetAmount().GetSatoshiValue(),
               amount.GetSatoshiValue());
  EXPECT_STREQ(txout.GetLockingScript().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetNonce().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetRangeProof().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetSurjectionProof().GetHex().c_str(), "");
  EXPECT_EQ(txout.GetValue().GetSatoshiValue(), 0);
}